

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> * __thiscall
pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::operator=
          (vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *this,
          vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *other)

{
  Image *pIVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  if (this != other) {
    if ((this->alloc).memoryResource == (other->alloc).memoryResource) {
      pIVar1 = this->ptr;
      this->ptr = other->ptr;
      other->ptr = pIVar1;
      sVar2 = this->nAlloc;
      this->nAlloc = other->nAlloc;
      other->nAlloc = sVar2;
      sVar2 = this->nStored;
      this->nStored = other->nStored;
      other->nStored = sVar2;
    }
    else {
      clear(this);
      reserve(this,other->nStored);
      uVar3 = other->nStored;
      if (uVar3 != 0) {
        lVar5 = 0;
        uVar4 = 0;
        do {
          pmr::polymorphic_allocator<pbrt::Image>::construct<pbrt::Image,pbrt::Image>
                    (&this->alloc,(Image *)((long)&this->ptr->format + lVar5),
                     (Image *)((long)&other->ptr->format + lVar5));
          uVar4 = uVar4 + 1;
          uVar3 = other->nStored;
          lVar5 = lVar5 + 0x98;
        } while (uVar4 < uVar3);
      }
      this->nStored = uVar3;
    }
  }
  return this;
}

Assistant:

vector &operator=(vector &&other) {
        if (this == &other)
            return *this;

        if (alloc == other.alloc) {
            pstd::swap(ptr, other.ptr);
            pstd::swap(nAlloc, other.nAlloc);
            pstd::swap(nStored, other.nStored);
        } else {
            clear();
            reserve(other.size());
            for (size_t i = 0; i < other.size(); ++i)
                alloc.template construct<T>(ptr + i, std::move(other[i]));
            nStored = other.size();
        }

        return *this;
    }